

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O2

int pybind11_object_init(PyObject *self,PyObject *param_2,PyObject *param_3)

{
  string msg;
  string local_28;
  
  pybind11::detail::get_fully_qualified_tp_name_abi_cxx11_
            (&local_28,(detail *)self->ob_type,(PyTypeObject *)param_3);
  std::operator+(&msg,&local_28,": No constructor defined!");
  std::__cxx11::string::~string((string *)&local_28);
  PyErr_SetString(_PyExc_TypeError,msg._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&msg);
  return -1;
}

Assistant:

inline int pybind11_object_init(PyObject *self, PyObject *, PyObject *) {
    PyTypeObject *type = Py_TYPE(self);
    std::string msg = get_fully_qualified_tp_name(type) + ": No constructor defined!";
    set_error(PyExc_TypeError, msg.c_str());
    return -1;
}